

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void __thiscall TestSuite::ThreadHolder::~ThreadHolder(ThreadHolder *this)

{
  join(this,true);
  std::_Function_base::~_Function_base(&(this->args).func.super__Function_base);
  std::_Function_base::~_Function_base(&(this->handler).super__Function_base);
  return;
}

Assistant:

~ThreadHolder() { join(true); }